

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_functs.hpp
# Opt level: O2

void Limonp::loadStr2File(char *filename,openmode mode,string *str)

{
  long lVar1;
  char *__first;
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  ofstream out;
  long local_210 [29];
  long alStack_128 [35];
  
  std::ofstream::ofstream(local_210,filename,mode);
  lVar1 = *(long *)((long)alStack_128 + *(long *)(local_210[0] + -0x18));
  __first = (str->_M_dataplus)._M_p;
  __result._M_failed = lVar1 == 0;
  __result._M_sbuf = (streambuf_type *)lVar1;
  __result._9_7_ = 0;
  std::__copy_move_a2<false,char>(__first,__first + str->_M_string_length,__result);
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

inline void loadStr2File(const char * const filename, ios_base::openmode mode, const string& str)
    {
        ofstream out(filename, mode);
        ostreambuf_iterator<char> itr (out);
        copy(str.begin(), str.end(), itr);
        out.close();
    }